

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  string *psVar4;
  char cVar5;
  IMutableContext *pIVar6;
  undefined8 *puVar7;
  long *plVar8;
  char *pcVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  ulong uVar13;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + value->_M_string_length);
  pIVar6 = getCurrentMutableContext();
  (*(pIVar6->super_IContext)._vptr_IContext[6])(&local_f8);
  cVar5 = (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x58))();
  local_58 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x18))();
  }
  if ((cVar5 != '\0') && (local_b8._M_string_length != 0)) {
    paVar1 = &local_f8.field_2;
    uVar13 = 0;
    do {
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      if (local_b8._M_dataplus._M_p[uVar13] == '\t') {
        pcVar9 = "\\t";
LAB_0013c581:
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,(ulong)pcVar9);
        if (local_f8._M_string_length != 0) {
          std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b8);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_50,(ulong)local_f8._M_dataplus._M_p);
          puVar10 = (ulong *)(plVar8 + 2);
          if ((ulong *)*plVar8 == puVar10) {
            local_c8 = *puVar10;
            lStack_c0 = plVar8[3];
            local_d8 = &local_c8;
          }
          else {
            local_c8 = *puVar10;
            local_d8 = (ulong *)*plVar8;
          }
          local_d0 = plVar8[1];
          *plVar8 = (long)puVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          uVar13 = uVar13 + 1;
          std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_b8);
          uVar12 = 0xf;
          if (local_d8 != &local_c8) {
            uVar12 = local_c8;
          }
          if (uVar12 < (ulong)(local_90 + local_d0)) {
            uVar12 = 0xf;
            if (local_98 != local_88) {
              uVar12 = local_88[0];
            }
            if (uVar12 < (ulong)(local_90 + local_d0)) goto LAB_0013c661;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
          }
          else {
LAB_0013c661:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98);
          }
          plVar8 = puVar7 + 2;
          if ((long *)*puVar7 == plVar8) {
            local_68 = *plVar8;
            uStack_60 = puVar7[3];
            local_78 = &local_68;
          }
          else {
            local_68 = *plVar8;
            local_78 = (long *)*puVar7;
          }
          local_70 = puVar7[1];
          *puVar7 = plVar8;
          puVar7[1] = 0;
          *(undefined1 *)plVar8 = 0;
          std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_78);
          if (local_78 != &local_68) {
            operator_delete(local_78,local_68 + 1);
          }
          if (local_98 != local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
      }
      else {
        pcVar9 = "\\n";
        if (local_b8._M_dataplus._M_p[uVar13] == '\n') goto LAB_0013c581;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < local_b8._M_string_length);
  }
  std::operator+(&local_f8,"\"",&local_b8);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar4 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar11) {
    lVar3 = plVar8[3];
    (local_58->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&local_58->field_2 + 8) = lVar3;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar8;
    (local_58->field_2)._M_allocated_capacity = *psVar11;
  }
  local_58->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}